

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_35081::OverheadTest_Overhead_AlternatingSmallLargeBlocks_Test::TestBody
          (OverheadTest_Overhead_AlternatingSmallLargeBlocks_Test *this)

{
  int iVar1;
  char *pcVar2;
  AssertionResult gtest_ar;
  OverheadTest test;
  char *in_stack_ffffffffffffff78;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_80;
  AssertHelper local_78;
  char in_stack_ffffffffffffff90;
  undefined7 in_stack_ffffffffffffff91;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  upb_Arena *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  
  OverheadTest::OverheadTest((OverheadTest *)&stack0xffffffffffffffa0,0x200,0x1000);
  iVar1 = 100;
  do {
    OverheadTest::Alloc((OverheadTest *)&stack0xffffffffffffffa0,5000);
    OverheadTest::Alloc((OverheadTest *)&stack0xffffffffffffffa0,0x40);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  upb_Arena_SpaceAllocated(in_stack_ffffffffffffffa0,(size_t *)0x0);
  testing::internal::DoubleNearPredFormat
            (in_stack_ffffffffffffff78,(char *)0x16e90e,in_stack_ffffffffffffffa8,
             (double)in_stack_ffffffffffffffa0,(double)in_stack_ffffffffffffff98,
             (double)CONCAT71(in_stack_ffffffffffffff91,in_stack_ffffffffffffff90));
  if (in_stack_ffffffffffffff90 == '\0') {
    testing::Message::Message((Message *)&local_80);
    if (in_stack_ffffffffffffff98 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (in_stack_ffffffffffffff98->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mem/arena_test.cc"
               ,0xeb,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if (local_80._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_80._M_head_impl + 8))();
    }
  }
  if (in_stack_ffffffffffffff98 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffff98,in_stack_ffffffffffffff98);
  }
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<void_*,_unsigned_long>,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
  ::AssertNotDebugCapacity
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<void_*,_unsigned_long>,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
              *)&stack0xffffffffffffffa8);
  testing::internal::DoubleNearPredFormat
            (in_stack_ffffffffffffff78,(char *)0x16e9fb,in_stack_ffffffffffffffa8,
             (double)in_stack_ffffffffffffffa0,(double)in_stack_ffffffffffffff98,
             (double)CONCAT71(in_stack_ffffffffffffff91,in_stack_ffffffffffffff90));
  if (in_stack_ffffffffffffff90 == '\0') {
    testing::Message::Message((Message *)&local_80);
    if (in_stack_ffffffffffffff98 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (in_stack_ffffffffffffff98->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mem/arena_test.cc"
               ,0xec,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if (local_80._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_80._M_head_impl + 8))();
    }
  }
  if (in_stack_ffffffffffffff98 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffff98,in_stack_ffffffffffffff98);
  }
  OverheadTest::~OverheadTest((OverheadTest *)&stack0xffffffffffffffa0);
  return;
}

Assistant:

TEST(OverheadTest, Overhead_AlternatingSmallLargeBlocks) {
  OverheadTest test(512, 4096);
  for (int i = 0; i < 100; i++) {
    test.Alloc(5000);
    test.Alloc(64);
  }
  if (!UPB_ASAN) {
    EXPECT_NEAR(test.WastePct(), 0.007, 0.0025);
    EXPECT_NEAR(test.AmortizedAlloc(), 0.52, 0.025);
  }
}